

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.cc
# Opt level: O3

int ixxx::linux::signalfd(int __fd,sigset_t *__mask,int __flags)

{
  int iVar1;
  signalfd_error *this;
  int *piVar2;
  
  iVar1 = ::signalfd(__fd,__mask,__flags);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (signalfd_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  signalfd_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&signalfd_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

int signalfd(int fd, const sigset_t *mask, int flags)
    {
        int r = ::signalfd(fd, mask, flags);
        if (r == -1)
            throw signalfd_error(errno);
        return r;
    }